

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O3

void __thiscall serialization::xml_iarchive::load(xml_iarchive *this,string *v)

{
  char *pcVar1;
  _Elt_pointer ppxVar2;
  char *__s;
  
  ppxVar2 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar2 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar2 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pcVar1 = (ppxVar2[-1]->super_xml_base<char>).m_value;
  __s = &rapidxml::xml_base<char>::nullstr()::zero;
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  pcVar1 = (char *)v->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)v,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

void load(std::string & v) const
    {
        v = stack_.top()->value();
    }